

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.h
# Opt level: O2

void emitter_json_array_kv_begin(emitter_t *emitter,char *json_key)

{
  emitter_json_key(emitter,json_key);
  if (emitter->output < emitter_output_table) {
    emitter_json_key_prefix(emitter);
    emitter_printf(emitter,"[");
    emitter->nesting_depth = emitter->nesting_depth + 1;
    emitter->item_at_depth = false;
  }
  return;
}

Assistant:

static inline void
emitter_json_array_kv_begin(emitter_t *emitter, const char *json_key) {
	emitter_json_key(emitter, json_key);
	emitter_json_array_begin(emitter);
}